

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

error_code __thiscall
slang::SourceManager::addSystemDirectories(SourceManager *this,string_view pattern)

{
  iterator __position;
  error_code eVar1;
  unique_lock<std::shared_mutex> lock;
  SmallVector<std::filesystem::__cxx11::path,_2UL> dirs;
  error_code ec;
  bool in_stack_000001e7;
  SmallVector<std::filesystem::__cxx11::path,_2UL> *in_stack_000001e8;
  GlobMode in_stack_000001f4;
  path *in_stack_000001f8;
  string_view in_stack_00000200;
  error_code *in_stack_00000220;
  mutex_type *__m;
  path *in_stack_fffffffffffffec0;
  SmallVectorBase<std::filesystem::__cxx11::path> *this_00;
  path *__last;
  SmallVectorBase<std::filesystem::__cxx11::path> *__first;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  *in_stack_ffffffffffffff00;
  path local_b8;
  SmallVectorBase<std::filesystem::__cxx11::path> local_90 [2];
  undefined4 local_10;
  undefined8 local_8;
  
  __first = local_90;
  SmallVector<std::filesystem::__cxx11::path,_2UL>::SmallVector
            ((SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x32883e);
  __m = (mutex_type *)&stack0xfffffffffffffff0;
  std::error_code::error_code((error_code *)in_stack_fffffffffffffec0);
  __last = &local_b8;
  std::filesystem::__cxx11::path::path(in_stack_fffffffffffffec0);
  svGlob(in_stack_000001f8,in_stack_00000200,in_stack_000001f4,in_stack_000001e8,in_stack_000001e7,
         in_stack_00000220);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffec0);
  std::unique_lock<std::shared_mutex>::unique_lock
            ((unique_lock<std::shared_mutex> *)in_stack_fffffffffffffec0,__m);
  __position = std::
               vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ::end((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                      *)__m);
  __gnu_cxx::
  __normal_iterator<std::filesystem::__cxx11::path_const*,std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>>
  ::__normal_iterator<std::filesystem::__cxx11::path*>
            ((__normal_iterator<const_std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
              *)in_stack_fffffffffffffec0,
             (__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
              *)__m);
  this_00 = local_90;
  SmallVectorBase<std::filesystem::__cxx11::path>::begin(this_00);
  SmallVectorBase<std::filesystem::__cxx11::path>::end(this_00);
  std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
  insert<std::filesystem::__cxx11::path*,void>
            (in_stack_ffffffffffffff00,(const_iterator)__position._M_current,(path *)__first,__last)
  ;
  std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)this_00);
  SmallVector<std::filesystem::__cxx11::path,_2UL>::~SmallVector
            ((SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x328952);
  eVar1._4_4_ = 0;
  eVar1._M_value = local_10;
  eVar1._M_cat = (error_category *)local_8;
  return eVar1;
}

Assistant:

std::error_code SourceManager::addSystemDirectories(std::string_view pattern) {
    SmallVector<fs::path> dirs;
    std::error_code ec;
    svGlob({}, pattern, GlobMode::Directories, dirs, /* expandEnvVars */ false, ec);

    // Note: locking the separate mutex for include dirs here.
    std::unique_lock<std::shared_mutex> lock(includeDirMutex);
    systemDirectories.insert(systemDirectories.end(), dirs.begin(), dirs.end());
    return ec;
}